

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::RunAlgorithm
          (DeadReckoningCalculator *this,KFLOAT32 totalTimeSinceReset,WorldCoordinates *PositionOut,
          EulerAngles *OrientationOut)

{
  EulerAngles *OrientationOut_local;
  WorldCoordinates *PositionOut_local;
  KFLOAT32 totalTimeSinceReset_local;
  DeadReckoningCalculator *this_local;
  
  switch(this->m_DRA) {
  case DRM_F_P_W:
    calcDeadReckoningFPW(this,PositionOut,totalTimeSinceReset);
    break;
  case DRM_R_P_W:
    if (1e-05 <= (float)this->m_f64Magnitude) {
      calcDeadReckoningRPW(this,PositionOut,OrientationOut,totalTimeSinceReset);
    }
    else {
      calcDeadReckoningFPW(this,PositionOut,totalTimeSinceReset);
    }
    break;
  case DRM_R_V_W:
    if (1e-05 <= (float)this->m_f64Magnitude) {
      calcDeadReckoningRVW(this,PositionOut,OrientationOut,totalTimeSinceReset);
    }
    else {
      calcDeadReckoningFVW(this,PositionOut,totalTimeSinceReset);
    }
    break;
  case DRM_F_V_W:
    calcDeadReckoningFVW(this,PositionOut,totalTimeSinceReset);
    break;
  case DRM_F_P_B:
    calcDeadReckoningFPB(this,PositionOut,totalTimeSinceReset);
    break;
  case DRM_R_P_B:
    calcDeadReckoningRPB(this,PositionOut,OrientationOut,totalTimeSinceReset);
    break;
  case DRM_R_V_B:
    calcDeadReckoningRVB(this,PositionOut,OrientationOut,totalTimeSinceReset);
    break;
  case DRM_F_V_B:
    calcDeadReckoningFVB(this,PositionOut,totalTimeSinceReset);
  }
  return;
}

Assistant:

void DeadReckoningCalculator::RunAlgorithm( const KFLOAT32 totalTimeSinceReset, WorldCoordinates& PositionOut, EulerAngles& OrientationOut )
{
    switch( m_DRA )
    {
    case DRM_F_P_W:
        calcDeadReckoningFPW( PositionOut, totalTimeSinceReset );
        break;

    case DRM_R_P_W:
        if( m_f64Magnitude < MAGIC_EPSILON )
            calcDeadReckoningFPW( PositionOut, totalTimeSinceReset );
        else
            calcDeadReckoningRPW( PositionOut, OrientationOut, totalTimeSinceReset );
        break;

    case DRM_R_V_W:
        if( m_f64Magnitude < MAGIC_EPSILON )
            calcDeadReckoningFVW( PositionOut, totalTimeSinceReset );
        else
            calcDeadReckoningRVW( PositionOut, OrientationOut, totalTimeSinceReset );
        break;

    case DRM_F_V_W:
        calcDeadReckoningFVW( PositionOut, totalTimeSinceReset );
        break;

    case DRM_F_P_B:
        calcDeadReckoningFPB( PositionOut, totalTimeSinceReset );
        break;

    case DRM_R_P_B:
        calcDeadReckoningRPB( PositionOut, OrientationOut, totalTimeSinceReset );
        break;

    case DRM_R_V_B:
        calcDeadReckoningRVB( PositionOut, OrientationOut, totalTimeSinceReset );
        break;

    case DRM_F_V_B:
        calcDeadReckoningFVB( PositionOut, totalTimeSinceReset );
        break;
    }
}